

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O1

void __thiscall umu::r3::r3(r3 *this)

{
  placeholder *ppVar1;
  uint7 uStack_2f;
  _func_int **pp_Stack_28;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rev).idx_ = 0;
  ppVar1 = (placeholder *)operator_new(0x28);
  ppVar1->_vptr_placeholder = (_func_int **)&PTR__holder_001c7c90;
  ppVar1[1]._vptr_placeholder = (_func_int **)(ppVar1 + 3);
  ppVar1[3]._vptr_placeholder = (_func_int **)((ulong)uStack_2f << 8);
  ppVar1[4]._vptr_placeholder = pp_Stack_28;
  ppVar1[2]._vptr_placeholder = (_func_int **)0x0;
  (this->rev).value_.content = ppVar1;
  return;
}

Assistant:

r3() :
        name(std::string()),
        data(std::vector<uint8_t>()),
        rev(_union_map_union_Union__0__())
        { }